

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

void __thiscall LoadTable::saveXml(LoadTable *this,ostream *s)

{
  allocator local_31;
  string local_30;
  
  std::operator<<(s,"<loadtable");
  std::__cxx11::string::string((string *)&local_30,"size",&local_31);
  a_v_i(s,&local_30,(long)this->size);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"num",&local_31);
  a_v_i(s,&local_30,(long)this->num);
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<(s,">\n  ");
  Address::saveXml(&this->addr,s);
  std::operator<<(s,"</loadtable>\n");
  return;
}

Assistant:

void LoadTable::saveXml(ostream &s) const

{
  s << "<loadtable";
  a_v_i(s,"size",size);
  a_v_i(s,"num",num);
  s << ">\n  ";
  addr.saveXml(s);
  s << "</loadtable>\n";
}